

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

With * sqlite3WithAdd(Parse *pParse,With *pWith,Cte *pCte)

{
  CteUse **ppCVar1;
  Select **ppSVar2;
  sqlite3 *db;
  char *pcVar3;
  ExprList *pEVar4;
  Select *pSVar5;
  char *pcVar6;
  undefined8 uVar7;
  int iVar8;
  long lVar9;
  With *pWVar10;
  int i;
  long lVar11;
  Cte *pCVar12;
  
  if (pCte == (Cte *)0x0) {
    return pWith;
  }
  db = pParse->db;
  pcVar3 = pCte->zName;
  if (pWith == (With *)0x0 || pcVar3 == (char *)0x0) {
    if (pWith == (With *)0x0) {
      pWVar10 = (With *)sqlite3DbMallocZero(db,0x40);
      goto LAB_00170940;
    }
    lVar9 = (long)pWith->nCte;
  }
  else {
    pCVar12 = pWith->a;
    for (lVar11 = 0; lVar9 = (long)pWith->nCte, lVar11 < lVar9; lVar11 = lVar11 + 1) {
      iVar8 = sqlite3StrICmp(pcVar3,pCVar12->zName);
      if (iVar8 == 0) {
        sqlite3ErrorMsg(pParse,"duplicate WITH table name: %s",pcVar3);
      }
      pCVar12 = pCVar12 + 1;
    }
  }
  pWVar10 = (With *)sqlite3DbRealloc(db,pWith,lVar9 * 0x30 + 0x40);
LAB_00170940:
  if (db->mallocFailed == '\0') {
    iVar8 = pWVar10->nCte;
    pWVar10->nCte = iVar8 + 1;
    pcVar3 = pCte->zName;
    pEVar4 = pCte->pCols;
    pSVar5 = pCte->pSelect;
    pcVar6 = pCte->zCteErr;
    uVar7 = *(undefined8 *)&pCte->eM10d;
    ppCVar1 = &pWVar10->a[iVar8].pUse;
    *ppCVar1 = pCte->pUse;
    ppCVar1[1] = (CteUse *)uVar7;
    ppSVar2 = &pWVar10->a[iVar8].pSelect;
    *ppSVar2 = pSVar5;
    ppSVar2[1] = (Select *)pcVar6;
    pWVar10->a[iVar8].zName = pcVar3;
    pWVar10->a[iVar8].pCols = pEVar4;
    sqlite3DbFreeNN(db,pCte);
  }
  else {
    cteClear(db,pCte);
    sqlite3DbFree(db,pCte);
    pWVar10 = pWith;
  }
  return pWVar10;
}

Assistant:

SQLITE_PRIVATE With *sqlite3WithAdd(
  Parse *pParse,          /* Parsing context */
  With *pWith,            /* Existing WITH clause, or NULL */
  Cte *pCte               /* CTE to add to the WITH clause */
){
  sqlite3 *db = pParse->db;
  With *pNew;
  char *zName;

  if( pCte==0 ){
    return pWith;
  }

  /* Check that the CTE name is unique within this WITH clause. If
  ** not, store an error in the Parse structure. */
  zName = pCte->zName;
  if( zName && pWith ){
    int i;
    for(i=0; i<pWith->nCte; i++){
      if( sqlite3StrICmp(zName, pWith->a[i].zName)==0 ){
        sqlite3ErrorMsg(pParse, "duplicate WITH table name: %s", zName);
      }
    }
  }

  if( pWith ){
    sqlite3_int64 nByte = sizeof(*pWith) + (sizeof(pWith->a[1]) * pWith->nCte);
    pNew = sqlite3DbRealloc(db, pWith, nByte);
  }else{
    pNew = sqlite3DbMallocZero(db, sizeof(*pWith));
  }
  assert( (pNew!=0 && zName!=0) || db->mallocFailed );

  if( db->mallocFailed ){
    sqlite3CteDelete(db, pCte);
    pNew = pWith;
  }else{
    pNew->a[pNew->nCte++] = *pCte;
    sqlite3DbFree(db, pCte);
  }

  return pNew;
}